

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O0

void __thiscall
amrex::MLCellLinOp::averageDownSolutionRHS
          (MLCellLinOp *this,int camrlev,MultiFab *crse_sol,MultiFab *crse_rhs,MultiFab *fine_sol,
          MultiFab *fine_rhs)

{
  MLLinOp *in_RDI;
  int in_stack_0000000c;
  int ncomp;
  int amrrr;
  int in_stack_ffffffffffffffbc;
  
  MLLinOp::AMRRefRatio(in_RDI,in_stack_ffffffffffffffbc);
  (*in_RDI->_vptr_MLLinOp[5])();
  average_down(fine_sol,fine_rhs,amrrr,ncomp,in_stack_0000000c);
  average_down(fine_sol,fine_rhs,amrrr,ncomp,in_stack_0000000c);
  return;
}

Assistant:

void
MLCellLinOp::averageDownSolutionRHS (int camrlev, MultiFab& crse_sol, MultiFab& crse_rhs,
                                     const MultiFab& fine_sol, const MultiFab& fine_rhs)
{
    const auto amrrr = AMRRefRatio(camrlev);
    const int ncomp = getNComp();
    amrex::average_down(fine_sol, crse_sol, 0, ncomp, amrrr);
    amrex::average_down(fine_rhs, crse_rhs, 0, ncomp, amrrr);
}